

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sidebar.c
# Opt level: O0

void split_sidebar(wchar_t *invheight,wchar_t *flheight)

{
  undefined4 local_30;
  undefined4 local_28;
  undefined4 local_20;
  wchar_t *flheight_local;
  wchar_t *invheight_local;
  
  if (inv_icount + L'\x01' < ui_flags.viewheight / 2) {
    local_20 = inv_icount + L'\x01';
  }
  else {
    local_20 = ui_flags.viewheight / 2;
  }
  *invheight = local_20;
  if (floor_icount + L'\x01' < (ui_flags.viewheight + -1) / 2) {
    local_28 = floor_icount + L'\x01';
  }
  else {
    local_28 = (ui_flags.viewheight + -1) / 2;
  }
  *flheight = local_28;
  if ((*flheight < floor_icount + L'\x01') && (*invheight < (ui_flags.viewheight + 1) / 2)) {
    if (floor_icount + L'\x01' < (ui_flags.viewheight - *invheight) + -1) {
      local_30 = floor_icount + L'\x01';
    }
    else {
      local_30 = (ui_flags.viewheight - *invheight) + L'\xffffffff';
    }
    *flheight = local_30;
  }
  *invheight = (ui_flags.viewheight - *flheight) + L'\xffffffff';
  return;
}

Assistant:

static void split_sidebar(int *invheight, int *flheight)
{
    *invheight = min(inv_icount+1, ui_flags.viewheight / 2);
    *flheight = min(floor_icount+1, (ui_flags.viewheight-1) / 2);

    /* if there is need and available space, expand the floor item list up */
    if (floor_icount+1 > *flheight && *invheight < (ui_flags.viewheight+1) / 2)
	*flheight = min(floor_icount+1, ui_flags.viewheight - *invheight - 1);

    /* assign all unused space to the inventory list whether it is needed or not */
    *invheight = ui_flags.viewheight - *flheight - 1;
}